

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O1

bool glcts::PipelineStatisticsQueryTestFunctional2::executeCopyImageSubDataTest(void *pThis)

{
  code *pcVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 err;
  long lVar3;
  
  lVar3 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x10))();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x134);
  pcVar1 = *(code **)(lVar3 + 0x310);
  if (pcVar1 != (code *)0x0 || bVar2) {
    (*pcVar1)(*(undefined4 *)((long)pThis + 0xdc),0xde1,0,0,0,0,*(undefined4 *)((long)pThis + 0xe0),
              0xde1,0,0,0,0,*(uint *)((long)pThis + 0xe8) >> 1,*(uint *)((long)pThis + 0xe4) >> 1,1)
    ;
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glCopyImageSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                    ,0xad5);
  }
  return pcVar1 != (code *)0x0 || bVar2;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeCopyImageSubDataTest(void* pThis)
{
	PipelineStatisticsQueryTestFunctional2* data_ptr = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl		 = data_ptr->m_context.getRenderContext().getFunctions();
	bool									result   = true;

	if (!glu::contextSupports(data_ptr->m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)) &&
		gl.copyImageSubData == NULL)
	{
		/* API is unavailable */
		return false;
	}

	/* Execute the API call */
	gl.copyImageSubData(data_ptr->m_to_draw_fbo_id, GL_TEXTURE_2D, 0,			 /* srcLevel */
						0,														 /* srcX */
						0,														 /* srcY */
						0,														 /* srcZ */
						data_ptr->m_to_read_fbo_id, GL_TEXTURE_2D, 0,			 /* dstLevel */
						0,														 /* dstX */
						0,														 /* dstY */
						0,														 /* dstZ */
						data_ptr->m_to_width / 2, data_ptr->m_to_height / 2, 1); /* src_depth */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyImageSubData() call failed.");

	/* All done */
	return result;
}